

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDtdPtr xmlCtxtParseDtd(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlChar *publicId,
                         xmlChar *systemId)

{
  xmlParserInputPtr *ppxVar1;
  int iVar2;
  uint uVar3;
  xmlDocPtr pxVar4;
  xmlDtdPtr pxVar5;
  _xmlNode *p_Var6;
  xmlParserInputPtr pxVar7;
  _xmlDtd *p_Var8;
  
  if (ctxt == (xmlParserCtxtPtr)0x0 || input == (xmlParserInputPtr)0x0) {
    p_Var8 = (_xmlDtd *)0x0;
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
    goto LAB_0013c51b;
  }
  iVar2 = xmlCtxtPushInput(ctxt,input);
  if (iVar2 < 0) {
    xmlFreeInputStream(input);
    return (xmlDtdPtr)0x0;
  }
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"none";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"none";
  }
  pxVar4 = xmlNewDoc("1.0");
  ctxt->myDoc = pxVar4;
  if (pxVar4 == (xmlDocPtr)0x0) {
    xmlCtxtErrMemory(ctxt);
LAB_0013c4e1:
    p_Var8 = (_xmlDtd *)0x0;
  }
  else {
    pxVar4->properties = 0x40;
    pxVar5 = xmlNewDtd(pxVar4,(xmlChar *)"none",publicId,systemId);
    ctxt->myDoc->extSubset = pxVar5;
    if (pxVar5 == (xmlDtdPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      xmlFreeDoc(ctxt->myDoc);
      goto LAB_0013c4e1;
    }
    xmlParseExternalSubset(ctxt,publicId,systemId);
    pxVar4 = ctxt->myDoc;
    if (ctxt->wellFormed == 0) {
LAB_0013c4c1:
      p_Var8 = (_xmlDtd *)0x0;
    }
    else {
      p_Var8 = pxVar4->extSubset;
      pxVar4->extSubset = (_xmlDtd *)0x0;
      if (p_Var8 == (_xmlDtd *)0x0) goto LAB_0013c4c1;
      p_Var8->doc = (_xmlDoc *)0x0;
      for (p_Var6 = p_Var8->children; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
        p_Var6->doc = (_xmlDoc *)0x0;
      }
    }
    xmlFreeDoc(pxVar4);
    ctxt->myDoc = (xmlDocPtr)0x0;
  }
  iVar2 = ctxt->inputNr;
  if ((long)iVar2 < 1) {
    input = (xmlParserInputPtr)0x0;
  }
  else {
    uVar3 = iVar2 - 1;
    ctxt->inputNr = uVar3;
    ppxVar1 = ctxt->inputTab;
    if (iVar2 == 1) {
      pxVar7 = (xmlParserInputPtr)0x0;
    }
    else {
      pxVar7 = ppxVar1[(long)iVar2 + -2];
    }
    ctxt->input = pxVar7;
    input = ppxVar1[uVar3];
    ppxVar1[uVar3] = (xmlParserInputPtr)0x0;
  }
LAB_0013c51b:
  xmlFreeInputStream(input);
  return p_Var8;
}

Assistant:

xmlDtdPtr
xmlCtxtParseDtd(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                const xmlChar *publicId, const xmlChar *systemId) {
    xmlDtdPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (publicId == NULL)
        publicId = BAD_CAST "none";
    if (systemId == NULL)
        systemId = BAD_CAST "none";

    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
        xmlErrMemory(ctxt);
        goto error;
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
                                       publicId, systemId);
    if (ctxt->myDoc->extSubset == NULL) {
        xmlErrMemory(ctxt);
        xmlFreeDoc(ctxt->myDoc);
        goto error;
    }

    xmlParseExternalSubset(ctxt, publicId, systemId);

    if (ctxt->wellFormed) {
        ret = ctxt->myDoc->extSubset;
        ctxt->myDoc->extSubset = NULL;
        if (ret != NULL) {
            xmlNodePtr tmp;

            ret->doc = NULL;
            tmp = ret->children;
            while (tmp != NULL) {
                tmp->doc = NULL;
                tmp = tmp->next;
            }
        }
    } else {
        ret = NULL;
    }
    xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

error:
    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}